

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

void __thiscall Am_Connection::Send(Am_Connection *this,Am_Value *value)

{
  unsigned_short uVar1;
  Am_Marshall_Method AVar2;
  Am_Value local_30;
  unsigned_long net_type;
  
  while ((this->data != (Am_Connection_Data *)0x0 && (this->data->connected == false))) {
    Wait_For_Connect();
  }
  local_30.value.long_value._2_6_ = 0;
  local_30.value.long_value._0_2_ = value->type;
  local_30.type = 2;
  uVar1 = OpenAmulet::Map<Am_Value,_unsigned_short,_std::less<Am_Value>_>::GetAt(&Types,&local_30);
  Am_Value::~Am_Value(&local_30);
  if (uVar1 != 0) {
    net_type = (unsigned_long)((uVar1 & 0xff00) << 8 | (uint)uVar1 << 0x18);
    send(*(int *)&(this->data->super_Am_Wrapper).field_0xc,&net_type,8,0);
    local_30.type = uVar1;
    AVar2 = OpenAmulet::Map<unsigned_short,_Am_Marshall_Method,_std::less<unsigned_short>_>::GetAt
                      (&Marshall_Methods,&local_30.type);
    (*AVar2.Call)(*(int *)&(this->data->super_Am_Wrapper).field_0xc,value,this);
    return;
  }
  Am_Error("Send:Tried to send unknown type!");
}

Assistant:

void
Am_Connection::Send(Am_Value value)
{
  while ((data != nullptr) && (!(data->connected))) {
    Am_Connection::Wait_For_Connect();
  }
  Am_Marshall_Method Marshaller;
  unsigned long type, net_type;

  type = Am_Connection::Types.GetAt(value.type);
  if (type == Am_NONE)
    Am_Error("Send:Tried to send unknown type!");
  else {
    net_type = htonl(type);
    send(data->m_socket, &net_type, sizeof(net_type), 0);
    Marshaller = (Am_Connection::Marshall_Methods.GetAt(type));
    Marshaller.Call(data->m_socket, value, this);
  }
}